

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_PlaySpawnSound
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *spawner;
  char *pcVar2;
  AActor *missile;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00433603;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004335ea:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00433603:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x18f6,
                  "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  spawner = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (spawner == (AActor *)0x0) goto LAB_00433575;
    bVar1 = DObject::IsKindOf((DObject *)spawner,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00433603;
    }
  }
  else {
    if (spawner != (AActor *)0x0) goto LAB_004335ea;
LAB_00433575:
    spawner = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00433622;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_004335f3:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00433622;
  }
  missile = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (missile == (AActor *)0x0) goto LAB_0043359e;
  }
  else {
    if (missile != (AActor *)0x0) goto LAB_004335f3;
LAB_0043359e:
    NullParam("\"missile\"");
    missile = (AActor *)param[1].field_0.field_1.a;
    if (missile == (AActor *)0x0) {
      missile = (AActor *)0x0;
      goto LAB_004335d2;
    }
  }
  bVar1 = DObject::IsKindOf((DObject *)missile,AActor::RegistrationInfo.MyClass);
  if (!bVar1) {
    pcVar2 = "missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00433622:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x18f7,
                  "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_004335d2:
  P_PlaySpawnSound(missile,spawner);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, PlaySpawnSound)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(missile, AActor);
	P_PlaySpawnSound(missile, self);
	return 0;
}